

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTPNStm * __thiscall CTcParser::parse_goto(CTcParser *this,int *err)

{
  _func_int **pp_Var1;
  CTPNStm *pCVar2;
  tc_toktyp_t tVar3;
  int iVar4;
  CTPNStmBase *this_00;
  int *siz;
  
  siz = err;
  tVar3 = CTcTokenizer::next(G_tok);
  if (tVar3 == TOKT_SYM) {
    this_00 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)siz);
    pp_Var1 = (_func_int **)(G_tok->curtok_).text_;
    pCVar2 = (CTPNStm *)(G_tok->curtok_).text_len_;
    CTPNStmBase::CTPNStmBase(this_00);
    this_00[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
    this_00[1].next_stm_ = pCVar2;
    (this_00->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_003236f0;
    CTcTokenizer::next(G_tok);
  }
  else {
    this_00 = (CTPNStmBase *)0x0;
    CTcTokenizer::log_error(0x2b57);
  }
  iVar4 = parse_req_sem();
  if (iVar4 != 0) {
    *err = 1;
    this_00 = (CTPNStmBase *)0x0;
  }
  return (CTPNStm *)this_00;
}

Assistant:

CTPNStm *CTcParser::parse_goto(int *err)
{
    CTPNStmGoto *goto_stm;
    
    /* skip the 'goto' keyword, and demand that a symbol follows */
    if (G_tok->next() == TOKT_SYM)
    {
        /* create the parse node for the 'goto' statement */
        goto_stm = new CTPNStmGoto(G_tok->getcur()->get_text(),
                                   G_tok->getcur()->get_text_len());
        
        /* skip the symbol */
        G_tok->next();
    }
    else
    {
        /* log the error */
        G_tok->log_error(TCERR_GOTO_REQ_LABEL);

        /* no statement */
        goto_stm = 0;
    }

    /* parse the required semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the statement node */
    return goto_stm;
}